

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PolysTestGroup::init
          (PolysTestGroup *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  TriangleData *pTVar5;
  int extraout_EAX;
  TestNode *pTVar6;
  undefined1 local_1dd8 [8];
  TriangleData polys_11 [5];
  TriangleData polys_10 [4];
  TriangleData polys_9 [3];
  TriangleData polys_8 [3];
  TriangleData polys_7 [5];
  TriangleData polys_6 [5];
  TriangleData polys_5 [5];
  TriangleData polys_4 [5];
  TriangleData polys_3 [5];
  TriangleData polys_2 [6];
  TriangleData polys_1 [6];
  Vector<float,_4> local_a08;
  Vector<float,_4> local_9f8;
  Vector<float,_4> local_9e8;
  undefined1 local_9d8 [8];
  TriangleData polys [7];
  TriangleData attribPolys [4];
  TriangleData largeDepthPolys [3];
  TriangleData largePolys [3];
  TriangleData depthPolys [4];
  TriangleData viewportPolys [4];
  Vec4 blue;
  Vec4 yellow;
  Vec4 red;
  Vec4 white;
  float offset;
  float large;
  PolysTestGroup *this_local;
  
  pfVar1 = red.m_data + 2;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pfVar1,1.0,1.0,1.0,1.0);
  pfVar2 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pfVar2,1.0,0.0,0.0,1.0);
  pfVar3 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pfVar3,1.0,1.0,0.0,1.0);
  pfVar4 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pfVar4,0.0,0.0,1.0,1.0);
  pTVar5 = (TriangleData *)(depthPolys[3].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,-0.8,-0.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[0].c0.m_data + 2),-0.8,0.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[0].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[0].c1.m_data + 2),-1.3,0.05,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[0].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[0].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[1].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[1].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[1].c1.m_data + 2),-0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[1].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[1].c2.m_data + 2),-1.1,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[2].c0.m_data + 2),-1.1,1.1,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[2].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[2].c1.m_data + 2),-0.6,1.1,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[2].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[2].c2.m_data + 2),0.8,1.1,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[3].c0.m_data + 2),0.95,-1.1,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[3].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[3].c1.m_data + 2),3.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(viewportPolys[3].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(largePolys[2].c2.m_data + 2),-0.2,0.7,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[0].c0.m_data + 2),0.2,0.7,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[0].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[0].c1.m_data + 2),0.0,0.9,2.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[0].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[0].c2.m_data + 2),0.9,0.4,-1.5,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[1].c0.m_data + 2),0.9,-0.4,-1.5,1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[1].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[1].c1.m_data + 2),0.6,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[1].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[1].c2.m_data + 2),-0.9,0.6,-2.0,1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[2].c0.m_data + 2),-0.9,-0.6,-2.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[2].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[2].c1.m_data + 2),-0.4,0.0,2.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[2].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[2].c2.m_data + 2),0.0,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[3].c0.m_data + 2),0.0,0.5,-1.5,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[3].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthPolys[3].c1.m_data + 2),1.2,-0.9,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(depthPolys[3].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[2].c2.m_data + 2),-0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(largePolys[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[0].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[0].c1.m_data + 2),0.0,-100000.0,2.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[0].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(largePolys[0].c2.m_data + 2),0.5,0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[1].c0.m_data + 2),100000.0,0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[1].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[1].c1.m_data + 2),0.5,100000.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[1].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[1].c2.m_data + 2),-0.9,-100000.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[2].c0.m_data + 2),-1.1,-100000.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[2].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[2].c1.m_data + 2),-0.9,100000.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largePolys[2].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[3].c2.m_data + 2),-0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[0].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[0].c1.m_data + 2),0.0,-100000.0,100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[0].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[0].c2.m_data + 2),0.5,0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[1].c0.m_data + 2),0.9,50000.0,-100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[1].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[1].c1.m_data + 2),25000.0,0.0,-100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[1].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[1].c2.m_data + 2),-0.9,25000.0,100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[2].c0.m_data + 2),-0.5,-25000.0,-100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[2].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[2].c1.m_data + 2),-0.2,25000.0,100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(largeDepthPolys[2].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff8e8,-0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[0].p0.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attribPolys[0].c0.m_data + 2),0.2,-0.3,0.0,1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[0].p1.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[0].c1.m_data + 2),0.0,-100000.0,2.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[0].p2.m_data + 2),(Vector<float,_4> *)pfVar4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attribPolys[0].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[1].p0.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attribPolys[1].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[1].p1.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attribPolys[1].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[1].p2.m_data + 2),(Vector<float,_4> *)pfVar4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attribPolys[1].c2.m_data + 2),0.6,-1.2,0.0,1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[2].p0.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(attribPolys[2].c0.m_data + 2),1.2,-0.6,0.0,1.0)
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[2].p1.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff8d8,0.6,-0.6,0.0,1.0);
  tcu::operator*((tcu *)(attribPolys[2].c1.m_data + 2),16.0,
                 (Vector<float,_4> *)&stack0xfffffffffffff8d8);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[2].p2.m_data + 2),(Vector<float,_4> *)pfVar4);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[2].c2.m_data + 2),-0.9,25000.0,100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[3].p0.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[3].c0.m_data + 2),-0.5,-25000.0,-100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[3].p1.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[3].c1.m_data + 2),-0.2,25000.0,100000.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(attribPolys[3].p2.m_data + 2),(Vector<float,_4> *)pfVar4);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "poly_clip_viewport_center","polygon viewport clipping",pTVar5,
             (TriangleData *)(viewportPolys[3].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "poly_clip_viewport_corner","polygon viewport clipping",
             (TriangleData *)(depthPolys[3].c2.m_data + 2),
             (TriangleData *)(viewportPolys[3].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,"poly_z_clip",
             "polygon z clipping",(TriangleData *)(largePolys[2].c2.m_data + 2),
             (TriangleData *)(depthPolys[3].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "poly_z_clip_viewport_center","polygon z clipping",
             (TriangleData *)(largePolys[2].c2.m_data + 2),
             (TriangleData *)(depthPolys[3].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "poly_z_clip_viewport_corner","polygon z clipping",
             (TriangleData *)(largePolys[2].c2.m_data + 2),
             (TriangleData *)(depthPolys[3].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "large_poly_clip_viewport_center","polygon viewport clipping",
             (TriangleData *)(largeDepthPolys[2].c2.m_data + 2),
             (TriangleData *)(largePolys[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "large_poly_clip_viewport_corner","polygon viewport clipping",
             (TriangleData *)(largeDepthPolys[2].c2.m_data + 2),
             (TriangleData *)(largePolys[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,"large_poly_z_clip",
             "polygon z clipping",(TriangleData *)(attribPolys[3].c2.m_data + 2),
             (TriangleData *)(largeDepthPolys[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "large_poly_z_clip_viewport_center","polygon z clipping",
             (TriangleData *)(attribPolys[3].c2.m_data + 2),
             (TriangleData *)(largeDepthPolys[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "large_poly_z_clip_viewport_corner","polygon z clipping",
             (TriangleData *)(attribPolys[3].c2.m_data + 2),
             (TriangleData *)(largeDepthPolys[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "poly_attrib_clip","polygon clipping",(TriangleData *)&stack0xfffffffffffff8e8,
             (TriangleData *)(attribPolys[3].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "poly_attrib_clip_viewport_center","polygon clipping",
             (TriangleData *)&stack0xfffffffffffff8e8,(TriangleData *)(attribPolys[3].c2.m_data + 2)
             ,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "poly_attrib_clip_viewport_corner","polygon clipping",
             (TriangleData *)&stack0xfffffffffffff8e8,(TriangleData *)(attribPolys[3].c2.m_data + 2)
             ,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_9d8,-0.2,-0.3,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[0].c1.m_data + 2),0.0,-0.9,2.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[0].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[1].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[1].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[1].c2.m_data + 2),0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[2].c0.m_data + 2),1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector(&local_9e8,0.6,-0.6,0.0,1.0);
  tcu::operator*((tcu *)(polys[2].c1.m_data + 2),16.0,&local_9e8);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[2].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[2].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[3].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector(&local_9f8,0.6,0.6,0.0,1.0);
  tcu::operator*((tcu *)(polys[3].c1.m_data + 2),16.0,&local_9f8);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[3].c2.m_data + 2),-0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[4].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[4].c0.m_data + 2),-1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector(&local_a08,-0.6,0.6,0.0,1.0);
  tcu::operator*((tcu *)(polys[4].c1.m_data + 2),16.0,&local_a08);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[4].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[4].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[5].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[5].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[5].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  pfVar4 = polys_1[5].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pfVar4,-0.6,-0.6,0.0,1.0);
  tcu::operator*((tcu *)(polys[5].c1.m_data + 2),16.0,(Vector<float,_4> *)pfVar4);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[5].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[5].c2.m_data + 2),-0.9,0.225,0.9,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[6].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[6].c0.m_data + 2),-0.5,-0.225,-0.9,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[6].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys[6].c1.m_data + 2),-0.2,0.225,0.9,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys[6].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_0",
             "polygon clipping",(TriangleData *)local_9d8,(TriangleData *)(polys[6].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_0_viewport_center","polygon clipping",(TriangleData *)local_9d8,
             (TriangleData *)(polys[6].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_0_viewport_corner","polygon clipping",(TriangleData *)local_9d8,
             (TriangleData *)(polys[6].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff3a8,-0.2,-0.3,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[0].c1.m_data + 2),0.0,-0.9,2.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[0].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[1].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[1].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[1].c2.m_data + 2),0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[2].c0.m_data + 2),1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff398,0.6,-0.6,0.0,1.0);
  tcu::operator*((tcu *)(polys_1[2].c1.m_data + 2),16.0,(Vector<float,_4> *)&stack0xfffffffffffff398
                );
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[2].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[2].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[3].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff388,0.6,0.6,0.0,1.0);
  tcu::operator*((tcu *)(polys_1[3].c1.m_data + 2),16.0,(Vector<float,_4> *)&stack0xfffffffffffff388
                );
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[3].c2.m_data + 2),-0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[4].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[4].c0.m_data + 2),-1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff378,-0.6,0.6,0.0,1.0);
  tcu::operator*((tcu *)(polys_1[4].c1.m_data + 2),16.0,(Vector<float,_4> *)&stack0xfffffffffffff378
                );
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[4].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[4].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[5].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_1[5].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[5].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  pfVar1 = polys_2[5].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pfVar1,-0.6,-0.6,0.0,1.0);
  tcu::operator*((tcu *)(polys_1[5].c1.m_data + 2),16.0,(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_1[5].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_1",
             "polygon clipping",(TriangleData *)&stack0xfffffffffffff3a8,
             (TriangleData *)(polys_1[5].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_1_viewport_center","polygon clipping",
             (TriangleData *)&stack0xfffffffffffff3a8,(TriangleData *)(polys_1[5].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_1_viewport_corner","polygon clipping",
             (TriangleData *)&stack0xfffffffffffff3a8,(TriangleData *)(polys_1[5].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_3[4].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,-0.2,-0.3,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[0].c1.m_data + 2),0.0,-0.9,2.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[0].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[1].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[1].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[1].c2.m_data + 2),0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[2].c0.m_data + 2),1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[2].c1.m_data + 2),0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[2].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[2].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[3].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[3].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[3].c2.m_data + 2),-0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[4].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[4].c0.m_data + 2),-1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[4].c1.m_data + 2),-0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[4].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[4].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[5].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[5].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[5].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_2[5].c1.m_data + 2),-0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_2[5].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_2",
             "polygon clipping",pTVar5,(TriangleData *)(polys_2[5].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_2_viewport_center","polygon clipping",
             (TriangleData *)(polys_3[4].c2.m_data + 2),(TriangleData *)(polys_2[5].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_2_viewport_corner","polygon clipping",
             (TriangleData *)(polys_3[4].c2.m_data + 2),(TriangleData *)(polys_2[5].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_4[4].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,-0.2,-0.3,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[0].c1.m_data + 2),0.0,-0.9,-2.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[0].c2.m_data + 2),0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[1].c0.m_data + 2),1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[1].c1.m_data + 2),0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[1].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[2].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[2].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[2].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[2].c2.m_data + 2),-0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[3].c0.m_data + 2),-1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[3].c1.m_data + 2),-0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[3].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[4].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[4].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_3[4].c1.m_data + 2),-0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_3[4].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_3",
             "polygon clipping",pTVar5,(TriangleData *)(polys_3[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_3_viewport_center","polygon clipping",
             (TriangleData *)(polys_4[4].c2.m_data + 2),(TriangleData *)(polys_3[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_3_viewport_corner","polygon clipping",
             (TriangleData *)(polys_4[4].c2.m_data + 2),(TriangleData *)(polys_3[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_5[4].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,0.3,0.2,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[0].c0.m_data + 2),0.3,-0.2,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[0].c1.m_data + 2),0.9,0.0,2.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[0].c2.m_data + 2),0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[1].c0.m_data + 2),1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[1].c1.m_data + 2),0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[1].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[2].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[2].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[2].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[2].c2.m_data + 2),-0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[3].c0.m_data + 2),-1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[3].c1.m_data + 2),-0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[3].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[4].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[4].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_4[4].c1.m_data + 2),-0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_4[4].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_4",
             "polygon clipping",pTVar5,(TriangleData *)(polys_4[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_4_viewport_center","polygon clipping",
             (TriangleData *)(polys_5[4].c2.m_data + 2),(TriangleData *)(polys_4[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_4_viewport_corner","polygon clipping",
             (TriangleData *)(polys_5[4].c2.m_data + 2),(TriangleData *)(polys_4[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_6[4].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,-0.3,0.2,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[0].c0.m_data + 2),-0.3,-0.2,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[0].c1.m_data + 2),-0.9,0.0,2.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[0].c2.m_data + 2),0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[1].c0.m_data + 2),1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[1].c1.m_data + 2),0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[1].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[2].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[2].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[2].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[2].c2.m_data + 2),-0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[3].c0.m_data + 2),-1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[3].c1.m_data + 2),-0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[3].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[4].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[4].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_5[4].c1.m_data + 2),-0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_5[4].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_5",
             "polygon clipping",pTVar5,(TriangleData *)(polys_5[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_5_viewport_center","polygon clipping",
             (TriangleData *)(polys_6[4].c2.m_data + 2),(TriangleData *)(polys_5[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_5_viewport_corner","polygon clipping",
             (TriangleData *)(polys_6[4].c2.m_data + 2),(TriangleData *)(polys_5[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_7[4].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,-0.2,0.3,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[0].c0.m_data + 2),0.2,0.3,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[0].c1.m_data + 2),0.0,0.9,2.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[0].c2.m_data + 2),0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[1].c0.m_data + 2),1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[1].c1.m_data + 2),0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[1].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[2].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[2].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[2].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[2].c2.m_data + 2),-0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[3].c0.m_data + 2),-1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[3].c1.m_data + 2),-0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[3].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[4].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[4].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_6[4].c1.m_data + 2),-0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_6[4].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_6",
             "polygon clipping",pTVar5,(TriangleData *)(polys_6[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_6_viewport_center","polygon clipping",
             (TriangleData *)(polys_7[4].c2.m_data + 2),(TriangleData *)(polys_6[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_6_viewport_corner","polygon clipping",
             (TriangleData *)(polys_7[4].c2.m_data + 2),(TriangleData *)(polys_6[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_8[2].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,0.6,1.2,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[0].c0.m_data + 2),1.2,0.6,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[0].c1.m_data + 2),0.6,0.6,0.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[0].c2.m_data + 2),0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[1].c0.m_data + 2),1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[1].c1.m_data + 2),0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[1].c2.m_data + 2),0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[2].c0.m_data + 2),1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[2].c1.m_data + 2),0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[2].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[2].c2.m_data + 2),-0.6,1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[3].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[3].c0.m_data + 2),-1.2,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[3].c1.m_data + 2),-0.6,0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[3].c2.m_data + 2),-0.6,-1.2,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[4].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[4].c0.m_data + 2),-1.2,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_7[4].c1.m_data + 2),-0.6,-0.6,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_7[4].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_7",
             "polygon clipping",pTVar5,(TriangleData *)(polys_7[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_7_viewport_center","polygon clipping",
             (TriangleData *)(polys_8[2].c2.m_data + 2),(TriangleData *)(polys_7[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_7_viewport_corner","polygon clipping",
             (TriangleData *)(polys_8[2].c2.m_data + 2),(TriangleData *)(polys_7[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_9[2].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,-0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[0].p0.m_data + 2),(Vector<float,_4> *)(yellow.m_data + 2))
  ;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_8[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[0].p1.m_data + 2),(Vector<float,_4> *)(blue.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_8[0].c1.m_data + 2),0.0,-0.9,2.0,1.0);
  pfVar1 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[0].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_8[0].c2.m_data + 2),-1.0,-1.0,0.0,1.0);
  pfVar2 = red.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[1].p0.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_8[1].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[1].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_8[1].c1.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[1].p2.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_8[1].c2.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_8[2].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[2].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_8[2].c1.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_8[2].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_8",
             "polygon clipping",pTVar5,(TriangleData *)(polys_8[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_8_viewport_center","polygon clipping",
             (TriangleData *)(polys_9[2].c2.m_data + 2),(TriangleData *)(polys_8[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_8_viewport_corner","polygon clipping",
             (TriangleData *)(polys_9[2].c2.m_data + 2),(TriangleData *)(polys_8[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_10[3].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,-0.2,-0.3,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_9[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[0].p1.m_data + 2),(Vector<float,_4> *)(blue.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_9[0].c1.m_data + 2),0.0,-0.9,2.0,1.0);
  pfVar2 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[0].p2.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_9[0].c2.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[1].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_9[1].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[1].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_9[1].c1.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[1].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_9[1].c2.m_data + 2),-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[2].p0.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_9[2].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[2].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_9[2].c1.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_9[2].p2.m_data + 2),(Vector<float,_4> *)pfVar2);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_9",
             "polygon clipping",pTVar5,(TriangleData *)(polys_9[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_9_viewport_center","polygon clipping",
             (TriangleData *)(polys_10[3].c2.m_data + 2),(TriangleData *)(polys_9[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_9_viewport_corner","polygon clipping",
             (TriangleData *)(polys_10[3].c2.m_data + 2),(TriangleData *)(polys_9[2].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar5 = (TriangleData *)(polys_11[4].c2.m_data + 2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pTVar5,-0.2,-0.3,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[0].p1.m_data + 2),(Vector<float,_4> *)(blue.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[0].c1.m_data + 2),0.0,-0.9,2.0,1.0);
  pfVar2 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[0].p2.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[0].c2.m_data + 2),-1.0,-1.0,0.0,1.0);
  pfVar3 = red.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[1].p0.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[1].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[1].p1.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[1].c1.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[1].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[1].c2.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[2].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[2].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[2].c1.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[2].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[2].c2.m_data + 2),-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[3].p0.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[3].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[3].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_10[3].c1.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_10[3].p2.m_data + 2),(Vector<float,_4> *)pfVar2);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_10",
             "polygon clipping",pTVar5,(TriangleData *)(polys_10[3].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_10_viewport_center","polygon clipping",
             (TriangleData *)(polys_11[4].c2.m_data + 2),(TriangleData *)(polys_10[3].c2.m_data + 2)
             ,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_10_viewport_corner","polygon clipping",
             (TriangleData *)(polys_11[4].c2.m_data + 2),(TriangleData *)(polys_10[3].c2.m_data + 2)
             ,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1dd8,-0.2,-0.3,0.0,1.0);
  pfVar1 = yellow.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[0].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[0].c0.m_data + 2),0.2,-0.3,0.0,1.0);
  pfVar2 = blue.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[0].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[0].c1.m_data + 2),0.0,-0.9,2.0,1.0);
  pfVar3 = viewportPolys[3].c2.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[0].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[0].c2.m_data + 2),-1.0,-1.0,0.0,1.0);
  pfVar4 = red.m_data + 2;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[1].p0.m_data + 2),(Vector<float,_4> *)pfVar4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[1].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[1].p1.m_data + 2),(Vector<float,_4> *)pfVar4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[1].c1.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[1].p2.m_data + 2),(Vector<float,_4> *)pfVar4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[1].c2.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[2].p0.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[2].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[2].p1.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[2].c1.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[2].p2.m_data + 2),(Vector<float,_4> *)pfVar1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[2].c2.m_data + 2),-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[3].p0.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[3].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[3].p1.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[3].c1.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[3].p2.m_data + 2),(Vector<float,_4> *)pfVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[3].c2.m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[4].p0.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[4].c0.m_data + 2),1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[4].p1.m_data + 2),(Vector<float,_4> *)pfVar2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(polys_11[4].c1.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(polys_11[4].p2.m_data + 2),(Vector<float,_4> *)pfVar2);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,"multiple_11",
             "polygon clipping",(TriangleData *)local_1dd8,
             (TriangleData *)(polys_11[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_11_viewport_center","polygon clipping",(TriangleData *)local_1dd8,
             (TriangleData *)(polys_11[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  TriangleAttributeCase::TriangleAttributeCase
            ((TriangleAttributeCase *)pTVar6,(this->super_TestCaseGroup).m_context,
             "multiple_11_viewport_corner","polygon clipping",(TriangleData *)local_1dd8,
             (TriangleData *)(polys_11[4].c2.m_data + 2),
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  return extraout_EAX;
}

Assistant:

void PolysTestGroup::init (void)
{
	const float		large = 100000.0f;
	const float		offset = 0.9f;
	const tcu::Vec4 white	(1.0f, 1.0f, 1.0f, 1.0f);
	const tcu::Vec4 red		(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue	(0.0f, 0.0f, 1.0f, 1.0f);

	// basic cases
	{
		const TriangleCase::TriangleData viewportPolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.8f, -0.2f,  0.0f,  1.0f), white, tcu::Vec4(-0.8f,  0.2f,  0.0f,  1.0f), white, tcu::Vec4(-1.3f,  0.05f,  0.0f,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), white, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), white, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-1.1f,  0.6f,  0.0f,  1.0f), white, tcu::Vec4(-1.1f,  1.1f,  0.0f,  1.0f), white, tcu::Vec4(-0.6f,  1.1f,  0.0f,  1.0f), white},
			{tcu::Vec4( 0.8f,  1.1f,  0.0f,  1.0f), white, tcu::Vec4( 0.95f,-1.1f,  0.0f,  1.0f), white, tcu::Vec4( 3.0f,  0.0f,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData depthPolys[] =
		{
			// one vertex clipped to Z+
			{tcu::Vec4(-0.2f,  0.7f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f,  0.7f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f,  0.9f,  2.0f,  1.0f), white},

			// two vertices clipped to Z-
			{tcu::Vec4( 0.9f, 0.4f,  -1.5f,  1.0f), white, tcu::Vec4( 0.9f, -0.4f, -1.5f,  1.0f), white, tcu::Vec4( 0.6f,  0.0f,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, 0.6f,  -2.0f,  1.0f), white, tcu::Vec4(-0.9f, -0.6f, -2.0f,  1.0f), white, tcu::Vec4(-0.4f,  0.0f,  2.0f,  1.0f), white},

			// three vertices clipped by X, Y and Z
			{tcu::Vec4( 0.0f, -1.2f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f,  0.5f,  -1.5f, 1.0f), white, tcu::Vec4( 1.2f, -0.9f,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData largePolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f, -large,  2.0f,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4( 0.5f, 0.5f,  0.0f,  1.0f), white, tcu::Vec4( large, 0.5f, 0.0f,  1.0f), white, tcu::Vec4( 0.5f,  large,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, -large, 0.0f,  1.0f), white, tcu::Vec4(-1.1f, -large, 0.0f,  1.0f), white, tcu::Vec4(-0.9f,  large,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData largeDepthPolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f, -large, large,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4( 0.5f, 0.5f,  0.0f,  1.0f), white, tcu::Vec4( 0.9f, large/2, -large,  1.0f), white, tcu::Vec4( large/4, 0.0f, -large,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, large/4, large,  1.0f), white, tcu::Vec4(-0.5f, -large/4, -large,  1.0f), white, tcu::Vec4(-0.2f, large/4, large,  1.0f), white},
		};
		const TriangleCase::TriangleData attribPolys[] =
		{
			// one vertex clipped to edge, large
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -large,  2.0f,  1.0f), blue},

			// two vertices clipped to edges
			{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

			// two vertices clipped to edges, with non-uniform w
			{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},

			// three vertices clipped, large, Z
			{tcu::Vec4(-0.9f, large/4, large,  1.0f), red, tcu::Vec4(-0.5f, -large/4, -large,  1.0f), yellow, tcu::Vec4(-0.2f, large/4, large,  1.0f), blue},
		};

		addChild(new TriangleCase(m_context, "poly_clip_viewport_center",			"polygon viewport clipping",	DE_ARRAY_BEGIN(viewportPolys),		DE_ARRAY_END(viewportPolys),	VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "poly_clip_viewport_corner",			"polygon viewport clipping",	DE_ARRAY_BEGIN(viewportPolys),		DE_ARRAY_END(viewportPolys),	VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "poly_z_clip",							"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_WHOLE));
		addChild(new TriangleCase(m_context, "poly_z_clip_viewport_center",			"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "poly_z_clip_viewport_corner",			"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "large_poly_clip_viewport_center",		"polygon viewport clipping",	DE_ARRAY_BEGIN(largePolys),			DE_ARRAY_END(largePolys),		VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "large_poly_clip_viewport_corner",		"polygon viewport clipping",	DE_ARRAY_BEGIN(largePolys),			DE_ARRAY_END(largePolys),		VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "large_poly_z_clip",					"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_WHOLE));
		addChild(new TriangleCase(m_context, "large_poly_z_clip_viewport_center",	"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "large_poly_z_clip_viewport_corner",	"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_CORNER));

		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip",					"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_WHOLE));
		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_CENTER));
		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_CORNER));
	}

	// multiple polygons
	{
		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to edge
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges, with non-uniform w
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},

				// three vertices clipped, Z
				{tcu::Vec4(-0.9f, offset/4, offset,  1.0f), red, tcu::Vec4(-0.5f, -offset/4, -offset,  1.0f), yellow, tcu::Vec4(-0.2f, offset/4, offset,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_0",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_0_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_0_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges, with non-uniform w
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_1",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_1_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_1_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_2",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_2_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_2_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset, -2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_3",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_3_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_3_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(0.3f,  0.2f,  0.0f,  1.0f), red, tcu::Vec4( 0.3f, -0.2f,  0.0f,  1.0f), yellow, tcu::Vec4( offset, 0.0f,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_4",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_4_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_4_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.3f,  0.2f,  0.0f,  1.0f), red, tcu::Vec4(-0.3f, -0.2f,  0.0f,  1.0f), yellow, tcu::Vec4(-offset, 0.0f,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_5",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_5_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_5_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, 0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_6",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_6_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_6_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_7",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_7_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_7_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), blue,	tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_8",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_8_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_8_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,  tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_9",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_9_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_9_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,   tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,   tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue,  tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_10",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_10_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_10_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white,  tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,    tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,    tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue,   tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue,   tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), yellow, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), yellow, tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), yellow},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_11",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_11_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_11_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}
	}
}